

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void check_source_state_int(SourceWrapper *src,ALenum param,ALint *current)

{
  uint in_EAX;
  ALint ival;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  (*REAL_alGetSourcei)(src->name,param,(ALint *)((long)&uStack_28 + 4));
  if (uStack_28._4_4_ != *current) {
    writele32(0xc);
    writele32(src->name);
    writele32(param);
    writele32(uStack_28._4_4_);
    *current = uStack_28._4_4_;
  }
  return;
}

Assistant:

static void check_source_state_int(SourceWrapper *src, const ALenum param, ALint *current)
{
    ALint ival = 0;
    REAL_alGetSourcei(src->name, param, &ival);
    if (ival != *current) {
        IO_EVENTENUM(ALEE_SOURCE_STATE_CHANGED_INT);
        IO_UINT32(src->name);
        IO_ENUM(param);
        IO_INT32(ival);
        *current = ival;
    }
}